

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<tcu::Vector<int,_3>_>::init
          (ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  deBool dVar3;
  uint uVar4;
  RenderContext *pRVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ContextInfo *pCVar6;
  char *pcVar7;
  undefined7 extraout_var_02;
  NotSupportedError *pNVar8;
  undefined7 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string message_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string message;
  bool supportsES32;
  ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  message.field_2._12_4_ = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,(ApiType)message.field_2._12_4_);
  bVar2 = std::operator==(&this->m_requiredExt,"GL_OES_sample_variables");
  uVar4 = (uint)CONCAT71(extraout_var,bVar2);
  if (!bVar2) {
    bVar2 = std::operator==(&this->m_requiredExt,"GL_EXT_geometry_shader");
    uVar4 = (uint)CONCAT71(extraout_var_00,bVar2);
    if (!bVar2) {
      bVar2 = std::operator==(&this->m_requiredExt,"GL_EXT_tessellation_shader");
      uVar4 = (uint)CONCAT71(extraout_var_01,bVar2);
      if (!bVar2) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          pCVar6 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar2 = glu::ContextInfo::isExtensionSupported(pCVar6,pcVar7);
          uVar4 = (uint)CONCAT71(extraout_var_02,bVar2);
          if (!bVar2) {
            message_1.field_2._M_local_buf[0xf] = '\x01';
            pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            std::operator+(&local_90,&this->m_requiredExt," not supported");
            tcu::NotSupportedError::NotSupportedError(pNVar8,&local_90);
            message_1.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                        tcu::NotSupportedError::~NotSupportedError);
          }
        }
        goto LAB_0236aee7;
      }
    }
  }
  if (!bVar1) {
    std::operator+(&local_60,"The test requires a 3.2 context or support for the extension ",
                   &this->m_requiredExt);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,".");
    std::__cxx11::string::~string((string *)&local_60);
    do {
      dVar3 = ::deGetFalse();
      if (dVar3 != 0) {
LAB_0236acfc:
        pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        tcu::NotSupportedError::NotSupportedError
                  (pNVar8,pcVar7,
                   "m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str())",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                   ,0xa8);
        __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pCVar6 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar2 = glu::ContextInfo::isExtensionSupported(pCVar6,pcVar7);
      if (!bVar2) goto LAB_0236acfc;
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    uVar4 = std::__cxx11::string::~string((string *)local_40);
  }
LAB_0236aee7:
  if (bVar1) {
    return uVar4;
  }
  bVar1 = std::operator==(&this->m_varName,"gl_MaxTessControlImageUniforms");
  if ((((!bVar1) &&
       (bVar1 = std::operator==(&this->m_varName,"gl_MaxTessEvaluationImageUniforms"), !bVar1)) &&
      (bVar1 = std::operator==(&this->m_varName,"gl_MaxTessControlAtomicCounters"), !bVar1)) &&
     ((bVar1 = std::operator==(&this->m_varName,"gl_MaxTessEvaluationAtomicCounters"), !bVar1 &&
      (bVar1 = std::operator==(&this->m_varName,"gl_MaxTessControlAtomicCounterBuffers"), !bVar1))))
  {
    bVar1 = std::operator==(&this->m_varName,"gl_MaxTessEvaluationAtomicCounterBuffers");
    if (!bVar1) {
      return (int)CONCAT71(extraout_var_03,bVar1);
    }
  }
  std::operator+(&local_d8,"The test requires a 3.2 context. The constant \'",&this->m_varName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 &local_d8,"\' is not supported.");
  std::__cxx11::string::~string((string *)&local_d8);
  pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (pNVar8,pcVar7,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0xb6);
  __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void ShaderBuiltinConstantCase<DataType>::init (void)
{
	const bool supportsES32 = contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (m_requiredExt == "GL_OES_sample_variables" || m_requiredExt == "GL_EXT_geometry_shader" || m_requiredExt == "GL_EXT_tessellation_shader")
	{
		if(!supportsES32)
		{
			const std::string message = "The test requires a 3.2 context or support for the extension " + m_requiredExt + ".";
			TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str()), message.c_str());
		}
	}
	else if (!m_requiredExt.empty() && !m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str()))
			throw tcu::NotSupportedError(m_requiredExt + " not supported");

	if (!supportsES32 && (m_varName == "gl_MaxTessControlImageUniforms"	||
		m_varName == "gl_MaxTessEvaluationImageUniforms"			||
		m_varName == "gl_MaxTessControlAtomicCounters"				||
		m_varName == "gl_MaxTessEvaluationAtomicCounters"			||
		m_varName == "gl_MaxTessControlAtomicCounterBuffers"		||
		m_varName == "gl_MaxTessEvaluationAtomicCounterBuffers"))
	{
		std::string message = "The test requires a 3.2 context. The constant '" + m_varName + "' is not supported.";
		TCU_THROW(NotSupportedError, message.c_str());
	}
}